

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repl.h
# Opt level: O2

void __thiscall repl::repl(repl *this)

{
  anon_class_1_0_00000001_for_m_object *in_RCX;
  undefined1 local_a9;
  undefined1 local_a8 [40];
  handler_id_type local_80;
  handler_id_type local_58;
  handler_id_type local_30;
  
  this->m_active = true;
  this->m_step = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a8 + 8),"help",(allocator<char> *)local_a8);
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_1_>
            (&local_30,
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)(local_a8 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a9,
             (anon_class_1_0_00000001_for_m_object *)in_RCX);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a8 + 8),"quit",(allocator<char> *)&local_a9);
  local_a8._0_8_ = this;
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_2_>
            (&local_58,
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)(local_a8 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
             (anon_class_8_1_8991fb9c_for_m_object *)in_RCX);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_a8 + 8),"echo",(allocator<char> *)local_a8);
  handlebars::
  dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::connect<repl::repl()::_lambda(auto:1)_3_>
            (&local_80,
             (dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)(local_a8 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a9,in_RCX);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  return;
}

Assistant:

repl()
    : m_step(0)
    , m_active(true)
  {
    events::connect("help", [](auto argv) { 
		std::cout << "valid commands: help quit echo\n";
	});
    events::connect("quit", [this](auto argv) { this->m_active = false; });
    events::connect("echo", [](auto argv) {
      for (auto t = argv.begin() + 1; t != argv.end(); ++t) {
        std::cout << *t << '\n';
      }
    });
  }